

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void __thiscall ptc::Print<wchar_t>::Print(Print<wchar_t> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Print<wchar_t> *local_10;
  Print<wchar_t> *this_local;
  
  local_10 = this;
  s_abi_cxx11_(&local_30,"\n",1);
  anon_unknown_4::StringConverter<wchar_t>((string *)this);
  std::__cxx11::string::~string((string *)&local_30);
  s_abi_cxx11_(&local_60," ",1);
  anon_unknown_4::StringConverter<wchar_t>((string *)&this->sep);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::wstring::wstring((wstring *)&this->pattern);
  this->flush = false;
  return;
}

Assistant:

explicit Print(): 
     end( StringConverter<T_str>( "\n"s ) ),
     sep( StringConverter<T_str>( " "s ) ),
     flush( false )
     {       
      #ifdef PTC_ENABLE_PERFORMANCE_IMPROVEMENTS
      performance_options();
      #endif
     }